

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

void __thiscall
create::Create::Create(Create *this,string *dev,int *baud,RobotModel m,bool install_signal_handler)

{
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (this->model).maxVelocity = m.maxVelocity;
  (this->model).wheelDiameter = m.wheelDiameter;
  (this->model).id = m.id;
  (this->model).version = m.version;
  (this->model).axleLength = m.axleLength;
  (this->model).baud = m.baud;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prevOnDataTime).__d.__r = 0;
  std::_Deque_base<float,_std::allocator<float>_>::_Deque_base
            (&(this->dtHistory).super__Deque_base<float,_std::allocator<float>_>);
  (this->poseCovar).data_.size_ = 0;
  (this->poseCovar).data_.data_ = (pointer)0x0;
  (this->poseCovar).size1_ = 0;
  (this->poseCovar).size2_ = 0;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  init(this,(EVP_PKEY_CTX *)(ulong)install_signal_handler);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  Serial::connect((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,(int)dev,(sockaddr *)baud,(socklen_t)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

Create::Create(const std::string& dev, const int& baud, RobotModel m, bool install_signal_handler)
    : model(m)
  {
    init(install_signal_handler);
    serial->connect(dev, baud);
  }